

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O2

void __thiscall icu_63::RBBINode::RBBINode(RBBINode *this,RBBINode *other)

{
  int iVar1;
  UVector *pUVar2;
  UnicodeString *src;
  UErrorCode status;
  
  (this->fText).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00245838;
  (this->fText).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fType = other->fType;
  this->fParent = (RBBINode *)0x0;
  this->fLeftChild = (RBBINode *)0x0;
  this->fRightChild = (RBBINode *)0x0;
  this->fInputSet = other->fInputSet;
  this->fPrecedence = other->fPrecedence;
  src = &other->fText;
  UnicodeString::operator=(&this->fText,src);
  iVar1 = other->fLastPos;
  this->fFirstPos = other->fFirstPos;
  this->fLastPos = iVar1;
  this->fNullable = other->fNullable;
  this->fVal = other->fVal;
  this->fRuleRoot = '\0';
  this->fChainIn = other->fChainIn;
  status = U_ZERO_ERROR;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar2 != (UVector *)0x0) {
    src = (UnicodeString *)&status;
    UVector::UVector(pUVar2,(UErrorCode *)src);
  }
  this->fFirstPosSet = pUVar2;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar2 != (UVector *)0x0) {
    src = (UnicodeString *)&status;
    UVector::UVector(pUVar2,(UErrorCode *)src);
  }
  this->fLastPosSet = pUVar2;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar2 != (UVector *)0x0) {
    UVector::UVector(pUVar2,&status);
  }
  this->fFollowPos = pUVar2;
  return;
}

Assistant:

RBBINode::RBBINode(const RBBINode &other) : UMemory(other) {
#ifdef RBBI_DEBUG
    fSerialNum   = ++gLastSerial;
#endif
    fType        = other.fType;
    fParent      = NULL;
    fLeftChild   = NULL;
    fRightChild  = NULL;
    fInputSet    = other.fInputSet;
    fPrecedence  = other.fPrecedence;
    fText        = other.fText;
    fFirstPos    = other.fFirstPos;
    fLastPos     = other.fLastPos;
    fNullable    = other.fNullable;
    fVal         = other.fVal;
    fRuleRoot    = FALSE;
    fChainIn     = other.fChainIn;
    UErrorCode     status = U_ZERO_ERROR;
    fFirstPosSet = new UVector(status);   // TODO - get a real status from somewhere
    fLastPosSet  = new UVector(status);
    fFollowPos   = new UVector(status);
}